

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O1

bool CommaSeparateAndAddOccurrence
               (Option *Handler,uint pos,StringRef ArgName,StringRef Value,bool MultiArg)

{
  char cVar1;
  int iVar2;
  void *pvVar3;
  size_t sVar4;
  char *pcVar5;
  ulong __n;
  char *__s;
  ulong __n_00;
  ulong uVar6;
  char *pcVar7;
  char *__s_00;
  ulong uVar8;
  bool bVar9;
  
  __n_00 = Value.Length;
  __s = Value.Data;
  sVar4 = ArgName.Length;
  pcVar5 = ArgName.Data;
  pcVar7 = __s;
  uVar6 = __n_00;
  if ((Handler->field_0xd & 2) != 0) {
    if ((__n_00 == 0) || (pvVar3 = memchr(__s,0x2c,__n_00), pvVar3 == (void *)0x0)) {
      uVar8 = 0xffffffffffffffff;
    }
    else {
      uVar8 = (long)pvVar3 - (long)__s;
    }
    bVar9 = uVar8 == 0xffffffffffffffff;
    if (!bVar9) {
      uVar6 = uVar8;
      if (__n_00 < uVar8) {
        uVar6 = __n_00;
      }
      iVar2 = (*Handler->_vptr_Option[10])(Handler,(ulong)pos,pcVar5,sVar4,__s,uVar6,(uint)MultiArg)
      ;
      cVar1 = (char)iVar2;
      __n = __n_00;
      __s_00 = __s;
      while (pcVar7 = __s, uVar6 = __n_00, cVar1 == '\0') {
        uVar6 = uVar8 + 1;
        if (__n < uVar8 + 1) {
          uVar6 = __n;
        }
        __s_00 = __s_00 + uVar6;
        __n = __n - uVar6;
        if ((__n == 0) || (pvVar3 = memchr(__s_00,0x2c,__n), pvVar3 == (void *)0x0)) {
          uVar8 = 0xffffffffffffffff;
        }
        else {
          uVar8 = (long)pvVar3 - (long)__s_00;
        }
        bVar9 = uVar8 == 0xffffffffffffffff;
        pcVar7 = __s_00;
        uVar6 = __n;
        if (bVar9) break;
        uVar6 = uVar8;
        if (__n < uVar8) {
          uVar6 = __n;
        }
        iVar2 = (*Handler->_vptr_Option[10])
                          (Handler,(ulong)pos,pcVar5,sVar4,__s_00,uVar6,(uint)MultiArg);
        cVar1 = (char)iVar2;
      }
    }
    if (!bVar9) {
      return true;
    }
  }
  iVar2 = (*Handler->_vptr_Option[10])(Handler,(ulong)pos,pcVar5,sVar4,pcVar7,uVar6);
  return SUB41(iVar2,0);
}

Assistant:

static bool CommaSeparateAndAddOccurrence(Option *Handler, unsigned pos,
                                          StringRef ArgName, StringRef Value,
                                          bool MultiArg = false) {
  // Check to see if this option accepts a comma separated list of values.  If
  // it does, we have to split up the value into multiple values.
  if (Handler->getMiscFlags() & CommaSeparated) {
    StringRef Val(Value);
    StringRef::size_type Pos = Val.find(',');

    while (Pos != StringRef::npos) {
      // Process the portion before the comma.
      if (Handler->addOccurrence(pos, ArgName, Val.substr(0, Pos), MultiArg))
        return true;
      // Erase the portion before the comma, AND the comma.
      Val = Val.substr(Pos + 1);
      // Check for another comma.
      Pos = Val.find(',');
    }

    Value = Val;
  }

  return Handler->addOccurrence(pos, ArgName, Value, MultiArg);
}